

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::AtomicFenceExpr,_std::default_delete<wabt::AtomicFenceExpr>_> __thiscall
wabt::MakeUnique<wabt::AtomicFenceExpr,unsigned_int&>(wabt *this,uint *args)

{
  uint uVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)operator_new(0x40);
  uVar1 = *args;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  puVar2[4] = 0;
  *(undefined8 *)((long)puVar2 + 0x24) = 0;
  *(undefined8 *)((long)puVar2 + 0x2c) = 0;
  *(undefined4 *)(puVar2 + 7) = 5;
  *puVar2 = &PTR__Expr_001f3e40;
  *(uint *)((long)puVar2 + 0x3c) = uVar1;
  *(undefined8 **)this = puVar2;
  return (__uniq_ptr_data<wabt::AtomicFenceExpr,_std::default_delete<wabt::AtomicFenceExpr>,_true,_true>
          )(__uniq_ptr_data<wabt::AtomicFenceExpr,_std::default_delete<wabt::AtomicFenceExpr>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}